

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

bool __thiscall cmFileLockPool::ScopePool::IsAlreadyLocked(ScopePool *this,string *filename)

{
  bool bVar1;
  reference ppcVar2;
  _Self local_30;
  _Self local_28;
  CIt i;
  string *filename_local;
  ScopePool *this_local;
  
  i._M_node = (_List_node_base *)filename;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmFileLock_*,_std::allocator<cmFileLock_*>_>::begin(&this->Locks);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmFileLock_*,_std::allocator<cmFileLock_*>_>::end(&this->Locks);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    ppcVar2 = std::_List_const_iterator<cmFileLock_*>::operator*(&local_28);
    bVar1 = cmFileLock::IsLocked(*ppcVar2,(string *)i._M_node);
    if (bVar1) break;
    std::_List_const_iterator<cmFileLock_*>::operator++(&local_28);
  }
  return true;
}

Assistant:

bool cmFileLockPool::ScopePool::IsAlreadyLocked(
    const std::string& filename) const
{
  for (CIt i = this->Locks.begin(); i != this->Locks.end(); ++i)
    {
    if ((*i)->IsLocked(filename))
      {
      return true;
      }
    }
  return false;
}